

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermIterators.cpp
# Opt level: O0

bool __thiscall Kernel::TopLevelVarLikeTermIterator::hasNext(TopLevelVarLikeTermIterator *this)

{
  Term **ppTVar1;
  bool bVar2;
  int iVar3;
  Term *term;
  size_t sVar4;
  Stack<Kernel::Term_*> *in_RDI;
  TermList tl;
  Term *t;
  TermList head;
  TermList in_stack_ffffffffffffffa8;
  TermList in_stack_ffffffffffffffb8;
  TermList in_stack_ffffffffffffffc0;
  TermList in_stack_ffffffffffffffc8;
  TermList local_28 [5];
  
  if ((hasNext()::args == '\0') && (iVar3 = __cxa_guard_acquire(&hasNext()::args), iVar3 != 0)) {
    Lib::Stack<Kernel::TermList>::Stack
              ((Stack<Kernel::TermList> *)in_stack_ffffffffffffffc0._content,
               in_stack_ffffffffffffffb8._content);
    __cxa_atexit(Lib::Stack<Kernel::TermList>::~Stack,&hasNext::args,&__dso_handle);
    __cxa_guard_release(&hasNext()::args);
  }
  TermList::TermList(local_28);
  ppTVar1 = in_RDI[1]._cursor;
  do {
    if (ppTVar1 != (Term **)0x0) {
      return true;
    }
    bVar2 = Lib::Stack<Kernel::Term_*>::isEmpty((Stack<Kernel::Term_*> *)&in_RDI->_cursor);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      return false;
    }
    term = Lib::Stack<Kernel::Term_*>::pop((Stack<Kernel::Term_*> *)&in_RDI->_cursor);
    ApplicativeHelper::getHeadAndArgs
              (term,(TermList *)in_stack_ffffffffffffffc8._content,
               (TermStack *)in_stack_ffffffffffffffc0._content);
    bVar2 = TermList::isVar((TermList *)in_RDI);
    if ((bVar2) && (sVar4 = Lib::Stack<Kernel::TermList>::size(&hasNext::args), sVar4 != 0)) {
      in_RDI[1]._cursor = (Term **)term;
    }
    else {
      in_stack_ffffffffffffffc8._content = local_28[0]._content;
      bVar2 = ApplicativeHelper::isComb(in_stack_ffffffffffffffa8);
      if (bVar2) {
        in_stack_ffffffffffffffc0._content = local_28[0]._content;
        Lib::Stack<Kernel::TermList>::size(&hasNext::args);
        bVar2 = ApplicativeHelper::isUnderApplied
                          (in_stack_ffffffffffffffc0,
                           (uint)(in_stack_ffffffffffffffb8._content >> 0x20));
        if ((!bVar2) && (bVar2 = Term::ground((Term *)0x993667), !bVar2)) {
          in_RDI[1]._cursor = (Term **)term;
          goto LAB_009936f1;
        }
      }
      while (bVar2 = Lib::Stack<Kernel::TermList>::isEmpty(&hasNext::args),
            ((bVar2 ^ 0xffU) & 1) != 0) {
        in_stack_ffffffffffffffb8 = Lib::Stack<Kernel::TermList>::pop(&hasNext::args);
        bVar2 = TermList::isApplication((TermList *)in_RDI);
        if (bVar2) {
          TermList::term((TermList *)0x9936bc);
          bVar2 = Term::ground((Term *)0x9936c4);
          if (!bVar2) {
            in_stack_ffffffffffffffa8._content = (uint64_t)&in_RDI->_cursor;
            TermList::term((TermList *)0x9936df);
            Lib::Stack<Kernel::Term_*>::push(in_RDI,(Term *)in_stack_ffffffffffffffa8._content);
          }
        }
      }
    }
LAB_009936f1:
    ppTVar1 = in_RDI[1]._cursor;
  } while( true );
}

Assistant:

bool TopLevelVarLikeTermIterator::hasNext()
{
  static TermStack args;
  TermList head;
  
  if(_next){ return true; }
  while(!_stack.isEmpty()){
    Term* t = _stack.pop();
    ASS(t->isApplication());
    AH::getHeadAndArgs(t, head, args);
    ASS(args.size());
    if(head.isVar() && args.size()){
      _next = t;
    } else if(AH::isComb(head) && !AH::isUnderApplied(head, args.size()) && !t->ground()){
      _next = t;
    } else {
      while(!args.isEmpty()){
        TermList tl = args.pop();
        if(tl.isApplication() && !tl.term()->ground()){
          _stack.push(tl.term());
        }
      }
    }
    if(_next) { return true; }
  }
  return false;  
}